

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

void power(Vm *vm)

{
  Compiler *compiler;
  TokenType TVar1;
  _Bool _Var2;
  uint8_t arg;
  Token local_50;
  
  primary(vm);
  compiler = &vm->compiler;
  do {
    while( true ) {
      while (TVar1 = (compiler->token).type, TVar1 == TOKEN_OPEN_PAREN) {
        while (_Var2 = match(vm,TOKEN_OPEN_PAREN), _Var2) {
          _Var2 = match(vm,TOKEN_CLOSE_PAREN);
          arg = '\0';
          if (!_Var2) {
            do {
              expr(vm);
              arg = arg + '\x01';
              _Var2 = match(vm,TOKEN_COMMA);
            } while (_Var2);
            consume(&local_50,vm,TOKEN_CLOSE_PAREN,"Expected \')\' after argument list");
          }
          emit_byte_arg(vm,OP_CALL,arg);
        }
      }
      if (TVar1 == TOKEN_DOT) break;
      if (TVar1 != TOKEN_OPEN_BRACKET) {
        _Var2 = match(vm,TOKEN_STAR_STAR);
        if (!_Var2) {
          return;
        }
        factor(vm);
        emit_no_arg(vm,OP_POW);
        return;
      }
      while (_Var2 = match(vm,TOKEN_OPEN_BRACKET), _Var2) {
        expr(vm);
        consume(&local_50,vm,TOKEN_CLOSE_BRACKET,"Expected \']\' after expression");
        handle_struct_assign(vm);
      }
    }
    while (_Var2 = match(vm,TOKEN_DOT), _Var2) {
      if ((compiler->token).type != TOKEN_IDENTIFIER) {
        error(compiler,"Expected identifier after \'.\'");
      }
      string(vm,false);
      advance(vm);
      handle_struct_assign(vm);
    }
  } while( true );
}

Assistant:

static void power(Vm *vm) {
    primary_expr(vm);

    if (match(vm, TOKEN_STAR_STAR)) {
        factor(vm);
        emit_no_arg(vm, OP_POW);
    }
}